

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int allocateBtreePage(BtShared *pBt,MemPage **ppPage,Pgno *pPgno,Pgno nearby,u8 eMode)

{
  u8 uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  MemPage *pMVar5;
  u8 *puVar6;
  Bitvec *p;
  DbPage *pPg;
  bool bVar7;
  MemPage *pMVar8;
  Pgno PVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  byte *pbVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  undefined7 in_register_00000081;
  char cVar20;
  MemPage *pMVar21;
  uint uVar22;
  uint uVar23;
  MemPage *pMVar24;
  bool bVar25;
  u8 eType;
  MemPage *pTrunk;
  MemPage *local_50;
  MemPage *local_48;
  uint local_3c;
  Pgno local_38;
  undefined4 local_34;
  
  local_48 = (MemPage *)0x0;
  pMVar5 = pBt->pPage1;
  uVar18 = pBt->nPage;
  uVar22 = *(uint *)(pMVar5->aData + 0x24);
  uVar22 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 | uVar22 << 0x18;
  if (uVar22 < uVar18) {
    if (uVar22 == 0) {
      uVar1 = pBt->bDoTruncate;
      iVar10 = sqlite3PagerWrite(pMVar5->pDbPage);
      if (iVar10 != 0) {
        return iVar10;
      }
      uVar22 = pBt->nPage;
      uVar18 = uVar22 + 1;
      pBt->nPage = uVar18;
      uVar23 = (uint)sqlite3PendingByte / pBt->pageSize;
      if (uVar22 == uVar23) {
        uVar18 = uVar22 + 2;
        pBt->nPage = uVar18;
      }
      uVar22 = (uint)(uVar1 == '\0');
      if (pBt->autoVacuum != '\0') {
        PVar9 = 0;
        if (1 < uVar18) {
          iVar10 = (uVar18 - 2) - (uVar18 - 2) % (pBt->usableSize / 5 + 1);
          PVar9 = iVar10 + (uint)(iVar10 + 1U == uVar23) + 2;
        }
        if (PVar9 == uVar18) {
          local_50 = (MemPage *)0x0;
          iVar10 = btreeGetPage(pBt,uVar18,&local_50,uVar22);
          pMVar5 = local_50;
          if (iVar10 != 0) {
            return iVar10;
          }
          iVar10 = sqlite3PagerWrite(local_50->pDbPage);
          sqlite3PagerUnrefNotNull(pMVar5->pDbPage);
          if (iVar10 != 0) {
            return iVar10;
          }
          uVar23 = pBt->nPage;
          uVar18 = uVar23 + 1;
          pBt->nPage = uVar18;
          if (uVar23 == (uint)sqlite3PendingByte / pBt->pageSize) {
            uVar18 = uVar23 + 2;
            pBt->nPage = uVar18;
          }
        }
      }
      *(uint *)(pBt->pPage1->aData + 0x1c) =
           uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
      PVar9 = pBt->nPage;
      *pPgno = PVar9;
      iVar10 = btreeGetPage(pBt,PVar9,ppPage,uVar22);
      if (iVar10 != 0) {
        return iVar10;
      }
      iVar10 = sqlite3PagerWrite((*ppPage)->pDbPage);
      if (iVar10 != 0) {
        if (*ppPage != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull((*ppPage)->pDbPage);
        }
        goto LAB_0012780a;
      }
    }
    else {
      local_34 = (undefined4)CONCAT71(in_register_00000081,eMode);
      local_38 = nearby;
      if (eMode == '\x02') {
        bVar25 = true;
      }
      else if ((eMode == '\x01') && (nearby <= uVar18)) {
        iVar10 = ptrmapGet(pBt,nearby,(u8 *)&local_50,(Pgno *)0x0);
        bVar25 = (char)local_50 == '\x02';
        if (iVar10 != 0) {
          return iVar10;
        }
      }
      else {
        bVar25 = false;
      }
      iVar10 = sqlite3PagerWrite(pMVar5->pDbPage);
      if (iVar10 != 0) {
        return iVar10;
      }
      uVar22 = uVar22 - 1;
      *(uint *)(pMVar5->aData + 0x24) =
           uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 | uVar22 * 0x1000000;
      pMVar24 = (MemPage *)0x0;
      do {
        if (pMVar24 == (MemPage *)0x0) {
          puVar6 = pMVar5->aData;
          uVar22 = (uint)puVar6[0x22] << 8 | (uint)puVar6[0x21] << 0x10 | (uint)puVar6[0x20] << 0x18
          ;
          pbVar13 = puVar6 + 0x23;
        }
        else {
          pbVar13 = pMVar24->aData;
          uVar22 = (uint)pbVar13[2] << 8 | (uint)pbVar13[1] << 0x10 | (uint)*pbVar13 << 0x18;
          pbVar13 = pbVar13 + 3;
        }
        uVar22 = *pbVar13 | uVar22;
        if (uVar18 < uVar22) {
          iVar10 = 0xb;
          sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xe3ca,
                      "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
          goto LAB_001277f7;
        }
        iVar10 = btreeGetPage(pBt,uVar22,&local_48,0);
        pMVar21 = local_48;
        if (iVar10 != 0) goto LAB_001277f7;
        puVar6 = local_48->aData;
        uVar23 = *(uint *)(puVar6 + 4);
        uVar23 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 | uVar23 << 0x18
        ;
        if ((bVar25) || (uVar23 != 0)) {
          if ((pBt->usableSize >> 2) - 2 < uVar23) {
            iVar10 = 0xb;
            sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xe3e7,
                        "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
            goto LAB_001277ee;
          }
          cVar20 = (char)local_34;
          if (bVar25) {
            if ((uVar22 == local_38) || (cVar20 == '\x02' && uVar22 < local_38)) {
              *pPgno = uVar22;
              *ppPage = local_48;
              iVar10 = sqlite3PagerWrite(local_48->pDbPage);
              if (iVar10 != 0) goto LAB_001277ee;
              if (uVar23 == 0) {
                if (pMVar24 == (MemPage *)0x0) {
                  *(undefined4 *)(pMVar5->aData + 0x20) = *(undefined4 *)pMVar21->aData;
                }
                else {
                  iVar10 = sqlite3PagerWrite(pMVar24->pDbPage);
                  if (iVar10 != 0) goto LAB_001277ee;
                  *(undefined4 *)pMVar24->aData = *(undefined4 *)pMVar21->aData;
                }
              }
              else {
                puVar6 = pMVar21->aData;
                bVar2 = puVar6[8];
                bVar3 = puVar6[9];
                bVar4 = puVar6[10];
                uVar22 = (uint)bVar4 << 8 | (uint)bVar3 << 0x10 | (uint)bVar2 << 0x18 |
                         (uint)puVar6[0xb];
                if (uVar18 < uVar22) {
                  iVar10 = 0xb;
                  sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xe409,
                              "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
                  goto LAB_001277ee;
                }
                local_3c = (uint)puVar6[0xb];
                iVar10 = btreeGetPage(pBt,uVar22,&local_50,0);
                pMVar8 = local_50;
                if (iVar10 != 0) goto LAB_001277ee;
                iVar10 = sqlite3PagerWrite(local_50->pDbPage);
                if (iVar10 != 0) {
                  sqlite3PagerUnrefNotNull(pMVar8->pDbPage);
                  goto LAB_001277ee;
                }
                *(undefined4 *)pMVar8->aData = *(undefined4 *)pMVar21->aData;
                uVar22 = uVar23 - 1;
                *(uint *)(pMVar8->aData + 4) =
                     uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                     uVar22 * 0x1000000;
                memcpy(pMVar8->aData + 8,pMVar21->aData + 0xc,(ulong)(uVar23 * 4 - 4));
                sqlite3PagerUnrefNotNull(pMVar8->pDbPage);
                if (pMVar24 == (MemPage *)0x0) {
                  puVar6 = pMVar5->aData;
                  puVar6[0x20] = bVar2;
                  puVar6[0x21] = bVar3;
                  puVar6[0x22] = bVar4;
                  pbVar13 = puVar6 + 0x23;
                }
                else {
                  iVar10 = sqlite3PagerWrite(pMVar24->pDbPage);
                  if (iVar10 != 0) goto LAB_001277ee;
                  pbVar13 = pMVar24->aData;
                  *pbVar13 = bVar2;
                  pbVar13[1] = bVar3;
                  pbVar13[2] = bVar4;
                  pbVar13 = pbVar13 + 3;
                }
                *pbVar13 = (byte)local_3c;
              }
              local_48 = (MemPage *)0x0;
              pMVar21 = (MemPage *)0x0;
              bVar7 = false;
              iVar10 = 0;
              goto LAB_00127632;
            }
          }
          if (uVar23 != 0) {
            uVar22 = 0;
            if (local_38 != 0) {
              if (cVar20 == '\x02') {
                uVar14 = 8;
                uVar15 = 0;
                do {
                  uVar17 = *(uint *)(puVar6 + (uVar14 & 0xffffffff));
                  if ((uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                      uVar17 << 0x18) <= local_38) {
                    uVar22 = (uint)uVar15;
                    break;
                  }
                  uVar15 = uVar15 + 1;
                  uVar14 = uVar14 + 4;
                } while (uVar23 != uVar15);
              }
              else {
                uVar22 = 0;
                if (uVar23 != 1) {
                  uVar22 = *(uint *)(puVar6 + 8);
                  iVar12 = (uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                           uVar22 << 0x18) - local_38;
                  iVar10 = -iVar12;
                  if (-1 < iVar12) {
                    iVar10 = iVar12;
                  }
                  uVar22 = 0;
                  uVar14 = 1;
                  uVar17 = 0xc;
                  do {
                    uVar11 = *(uint *)(puVar6 + uVar17);
                    iVar19 = (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                             uVar11 << 0x18) - local_38;
                    iVar12 = -iVar19;
                    if (-1 < iVar19) {
                      iVar12 = iVar19;
                    }
                    if (iVar12 < iVar10) {
                      uVar22 = (uint)uVar14;
                      iVar10 = iVar12;
                    }
                    uVar14 = uVar14 + 1;
                    uVar17 = uVar17 + 4;
                  } while (uVar23 != uVar14);
                }
              }
            }
            uVar17 = uVar22 * 4 + 8;
            uVar11 = *(uint *)(puVar6 + uVar17);
            uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                     uVar11 << 0x18;
            if (uVar18 < uVar11) {
              iVar10 = 0xb;
              sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xe44a,
                          "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
              goto LAB_00127658;
            }
            if (((uVar11 == local_38) || (cVar20 == '\x02' && uVar11 < local_38)) || (!bVar25)) {
              *pPgno = uVar11;
              iVar10 = sqlite3PagerWrite(local_48->pDbPage);
              if (iVar10 == 0) {
                uVar11 = uVar23 - 1;
                if (uVar22 < uVar11) {
                  *(undefined4 *)(puVar6 + uVar17) = *(undefined4 *)(puVar6 + (uVar23 * 4 + 4));
                }
                *(uint *)(puVar6 + 4) =
                     uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                     uVar11 * 0x1000000;
                uVar22 = *pPgno;
                p = pBt->pHasContent;
                if (p == (Bitvec *)0x0) {
                  uVar23 = 1;
                }
                else {
                  uVar23 = 0;
                  if (uVar22 <= p->iSize) {
                    iVar10 = sqlite3BitvecTest(p,uVar22);
                    uVar23 = (uint)(iVar10 == 0);
                  }
                }
                iVar10 = btreeGetPage(pBt,uVar22,ppPage,uVar23);
                if (((iVar10 == 0) &&
                    (iVar12 = sqlite3PagerWrite((*ppPage)->pDbPage), iVar10 = 0, iVar12 != 0)) &&
                   (iVar10 = iVar12, *ppPage != (MemPage *)0x0)) {
                  sqlite3PagerUnrefNotNull((*ppPage)->pDbPage);
                }
                bVar7 = false;
                goto LAB_00127632;
              }
              goto LAB_001277ee;
            }
            bVar25 = true;
          }
          iVar10 = 0;
          bVar7 = bVar25;
        }
        else {
          iVar10 = sqlite3PagerWrite(local_48->pDbPage);
          if (iVar10 != 0) goto LAB_001277ee;
          *pPgno = uVar22;
          *(undefined4 *)(pMVar5->aData + 0x20) = *(undefined4 *)pMVar21->aData;
          *ppPage = pMVar21;
          local_48 = (MemPage *)0x0;
          pMVar21 = (MemPage *)0x0;
          iVar10 = 0;
          bVar7 = false;
        }
LAB_00127632:
        if (pMVar24 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(pMVar24->pDbPage);
        }
        bVar25 = true;
        pMVar24 = pMVar21;
      } while (bVar7);
      pMVar24 = (MemPage *)0x0;
LAB_00127658:
      if (pMVar21 != (MemPage *)0x0) {
LAB_001277ee:
        sqlite3PagerUnrefNotNull(pMVar21->pDbPage);
      }
LAB_001277f7:
      if (pMVar24 != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(pMVar24->pDbPage);
      }
      if (iVar10 != 0) {
LAB_0012780a:
        *ppPage = (MemPage *)0x0;
        return iVar10;
      }
    }
    pPg = (*ppPage)->pDbPage;
    if (pPg->nRef < 2) {
      (*ppPage)->isInit = '\0';
      return 0;
    }
    sqlite3PagerUnrefNotNull(pPg);
    *ppPage = (MemPage *)0x0;
    uVar16 = 0xe4ad;
  }
  else {
    uVar16 = 0xe393;
  }
  sqlite3_log(0xb,"database corruption at line %d of [%.10s]",uVar16,
              "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
  return 0xb;
}

Assistant:

static int allocateBtreePage(
  BtShared *pBt,         /* The btree */
  MemPage **ppPage,      /* Store pointer to the allocated page here */
  Pgno *pPgno,           /* Store the page number here */
  Pgno nearby,           /* Search for a page near this one */
  u8 eMode               /* BTALLOC_EXACT, BTALLOC_LT, or BTALLOC_ANY */
){
  MemPage *pPage1;
  int rc;
  u32 n;     /* Number of pages on the freelist */
  u32 k;     /* Number of leaves on the trunk of the freelist */
  MemPage *pTrunk = 0;
  MemPage *pPrevTrunk = 0;
  Pgno mxPage;     /* Total size of the database file */

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( eMode==BTALLOC_ANY || (nearby>0 && IfNotOmitAV(pBt->autoVacuum)) );
  pPage1 = pBt->pPage1;
  mxPage = btreePagecount(pBt);
  /* EVIDENCE-OF: R-05119-02637 The 4-byte big-endian integer at offset 36
  ** stores stores the total number of pages on the freelist. */
  n = get4byte(&pPage1->aData[36]);
  testcase( n==mxPage-1 );
  if( n>=mxPage ){
    return SQLITE_CORRUPT_BKPT;
  }
  if( n>0 ){
    /* There are pages on the freelist.  Reuse one of those pages. */
    Pgno iTrunk;
    u8 searchList = 0; /* If the free-list must be searched for 'nearby' */
    
    /* If eMode==BTALLOC_EXACT and a query of the pointer-map
    ** shows that the page 'nearby' is somewhere on the free-list, then
    ** the entire-list will be searched for that page.
    */
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( eMode==BTALLOC_EXACT ){
      if( nearby<=mxPage ){
        u8 eType;
        assert( nearby>0 );
        assert( pBt->autoVacuum );
        rc = ptrmapGet(pBt, nearby, &eType, 0);
        if( rc ) return rc;
        if( eType==PTRMAP_FREEPAGE ){
          searchList = 1;
        }
      }
    }else if( eMode==BTALLOC_LE ){
      searchList = 1;
    }
#endif

    /* Decrement the free-list count by 1. Set iTrunk to the index of the
    ** first free-list trunk page. iPrevTrunk is initially 1.
    */
    rc = sqlite3PagerWrite(pPage1->pDbPage);
    if( rc ) return rc;
    put4byte(&pPage1->aData[36], n-1);

    /* The code within this loop is run only once if the 'searchList' variable
    ** is not true. Otherwise, it runs once for each trunk-page on the
    ** free-list until the page 'nearby' is located (eMode==BTALLOC_EXACT)
    ** or until a page less than 'nearby' is located (eMode==BTALLOC_LT)
    */
    do {
      pPrevTrunk = pTrunk;
      if( pPrevTrunk ){
        /* EVIDENCE-OF: R-01506-11053 The first integer on a freelist trunk page
        ** is the page number of the next freelist trunk page in the list or
        ** zero if this is the last freelist trunk page. */
        iTrunk = get4byte(&pPrevTrunk->aData[0]);
      }else{
        /* EVIDENCE-OF: R-59841-13798 The 4-byte big-endian integer at offset 32
        ** stores the page number of the first page of the freelist, or zero if
        ** the freelist is empty. */
        iTrunk = get4byte(&pPage1->aData[32]);
      }
      testcase( iTrunk==mxPage );
      if( iTrunk>mxPage ){
        rc = SQLITE_CORRUPT_BKPT;
      }else{
        rc = btreeGetPage(pBt, iTrunk, &pTrunk, 0);
      }
      if( rc ){
        pTrunk = 0;
        goto end_allocate_page;
      }
      assert( pTrunk!=0 );
      assert( pTrunk->aData!=0 );
      /* EVIDENCE-OF: R-13523-04394 The second integer on a freelist trunk page
      ** is the number of leaf page pointers to follow. */
      k = get4byte(&pTrunk->aData[4]);
      if( k==0 && !searchList ){
        /* The trunk has no leaves and the list is not being searched. 
        ** So extract the trunk page itself and use it as the newly 
        ** allocated page */
        assert( pPrevTrunk==0 );
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        *pPgno = iTrunk;
        memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
        *ppPage = pTrunk;
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
      }else if( k>(u32)(pBt->usableSize/4 - 2) ){
        /* Value of k is out of range.  Database corruption */
        rc = SQLITE_CORRUPT_BKPT;
        goto end_allocate_page;
#ifndef SQLITE_OMIT_AUTOVACUUM
      }else if( searchList 
            && (nearby==iTrunk || (iTrunk<nearby && eMode==BTALLOC_LE)) 
      ){
        /* The list is being searched and this trunk page is the page
        ** to allocate, regardless of whether it has leaves.
        */
        *pPgno = iTrunk;
        *ppPage = pTrunk;
        searchList = 0;
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        if( k==0 ){
          if( !pPrevTrunk ){
            memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc!=SQLITE_OK ){
              goto end_allocate_page;
            }
            memcpy(&pPrevTrunk->aData[0], &pTrunk->aData[0], 4);
          }
        }else{
          /* The trunk page is required by the caller but it contains 
          ** pointers to free-list leaves. The first leaf becomes a trunk
          ** page in this case.
          */
          MemPage *pNewTrunk;
          Pgno iNewTrunk = get4byte(&pTrunk->aData[8]);
          if( iNewTrunk>mxPage ){ 
            rc = SQLITE_CORRUPT_BKPT;
            goto end_allocate_page;
          }
          testcase( iNewTrunk==mxPage );
          rc = btreeGetPage(pBt, iNewTrunk, &pNewTrunk, 0);
          if( rc!=SQLITE_OK ){
            goto end_allocate_page;
          }
          rc = sqlite3PagerWrite(pNewTrunk->pDbPage);
          if( rc!=SQLITE_OK ){
            releasePage(pNewTrunk);
            goto end_allocate_page;
          }
          memcpy(&pNewTrunk->aData[0], &pTrunk->aData[0], 4);
          put4byte(&pNewTrunk->aData[4], k-1);
          memcpy(&pNewTrunk->aData[8], &pTrunk->aData[12], (k-1)*4);
          releasePage(pNewTrunk);
          if( !pPrevTrunk ){
            assert( sqlite3PagerIswriteable(pPage1->pDbPage) );
            put4byte(&pPage1->aData[32], iNewTrunk);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc ){
              goto end_allocate_page;
            }
            put4byte(&pPrevTrunk->aData[0], iNewTrunk);
          }
        }
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
#endif
      }else if( k>0 ){
        /* Extract a leaf from the trunk */
        u32 closest;
        Pgno iPage;
        unsigned char *aData = pTrunk->aData;
        if( nearby>0 ){
          u32 i;
          closest = 0;
          if( eMode==BTALLOC_LE ){
            for(i=0; i<k; i++){
              iPage = get4byte(&aData[8+i*4]);
              if( iPage<=nearby ){
                closest = i;
                break;
              }
            }
          }else{
            int dist;
            dist = sqlite3AbsInt32(get4byte(&aData[8]) - nearby);
            for(i=1; i<k; i++){
              int d2 = sqlite3AbsInt32(get4byte(&aData[8+i*4]) - nearby);
              if( d2<dist ){
                closest = i;
                dist = d2;
              }
            }
          }
        }else{
          closest = 0;
        }

        iPage = get4byte(&aData[8+closest*4]);
        testcase( iPage==mxPage );
        if( iPage>mxPage ){
          rc = SQLITE_CORRUPT_BKPT;
          goto end_allocate_page;
        }
        testcase( iPage==mxPage );
        if( !searchList 
         || (iPage==nearby || (iPage<nearby && eMode==BTALLOC_LE)) 
        ){
          int noContent;
          *pPgno = iPage;
          TRACE(("ALLOCATE: %d was leaf %d of %d on trunk %d"
                 ": %d more free pages\n",
                 *pPgno, closest+1, k, pTrunk->pgno, n-1));
          rc = sqlite3PagerWrite(pTrunk->pDbPage);
          if( rc ) goto end_allocate_page;
          if( closest<k-1 ){
            memcpy(&aData[8+closest*4], &aData[4+k*4], 4);
          }
          put4byte(&aData[4], k-1);
          noContent = !btreeGetHasContent(pBt, *pPgno)? PAGER_GET_NOCONTENT : 0;
          rc = btreeGetPage(pBt, *pPgno, ppPage, noContent);
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerWrite((*ppPage)->pDbPage);
            if( rc!=SQLITE_OK ){
              releasePage(*ppPage);
            }
          }
          searchList = 0;
        }
      }
      releasePage(pPrevTrunk);
      pPrevTrunk = 0;
    }while( searchList );
  }else{
    /* There are no pages on the freelist, so append a new page to the
    ** database image.
    **
    ** Normally, new pages allocated by this block can be requested from the
    ** pager layer with the 'no-content' flag set. This prevents the pager
    ** from trying to read the pages content from disk. However, if the
    ** current transaction has already run one or more incremental-vacuum
    ** steps, then the page we are about to allocate may contain content
    ** that is required in the event of a rollback. In this case, do
    ** not set the no-content flag. This causes the pager to load and journal
    ** the current page content before overwriting it.
    **
    ** Note that the pager will not actually attempt to load or journal 
    ** content for any page that really does lie past the end of the database
    ** file on disk. So the effects of disabling the no-content optimization
    ** here are confined to those pages that lie between the end of the
    ** database image and the end of the database file.
    */
    int bNoContent = (0==IfNotOmitAV(pBt->bDoTruncate))? PAGER_GET_NOCONTENT:0;

    rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
    if( rc ) return rc;
    pBt->nPage++;
    if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ) pBt->nPage++;

#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum && PTRMAP_ISPAGE(pBt, pBt->nPage) ){
      /* If *pPgno refers to a pointer-map page, allocate two new pages
      ** at the end of the file instead of one. The first allocated page
      ** becomes a new pointer-map page, the second is used by the caller.
      */
      MemPage *pPg = 0;
      TRACE(("ALLOCATE: %d from end of file (pointer-map page)\n", pBt->nPage));
      assert( pBt->nPage!=PENDING_BYTE_PAGE(pBt) );
      rc = btreeGetPage(pBt, pBt->nPage, &pPg, bNoContent);
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pPg->pDbPage);
        releasePage(pPg);
      }
      if( rc ) return rc;
      pBt->nPage++;
      if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ){ pBt->nPage++; }
    }
#endif
    put4byte(28 + (u8*)pBt->pPage1->aData, pBt->nPage);
    *pPgno = pBt->nPage;

    assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );
    rc = btreeGetPage(pBt, *pPgno, ppPage, bNoContent);
    if( rc ) return rc;
    rc = sqlite3PagerWrite((*ppPage)->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(*ppPage);
    }
    TRACE(("ALLOCATE: %d from end of file\n", *pPgno));
  }

  assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );

end_allocate_page:
  releasePage(pTrunk);
  releasePage(pPrevTrunk);
  if( rc==SQLITE_OK ){
    if( sqlite3PagerPageRefcount((*ppPage)->pDbPage)>1 ){
      releasePage(*ppPage);
      *ppPage = 0;
      return SQLITE_CORRUPT_BKPT;
    }
    (*ppPage)->isInit = 0;
  }else{
    *ppPage = 0;
  }
  assert( rc!=SQLITE_OK || sqlite3PagerIswriteable((*ppPage)->pDbPage) );
  return rc;
}